

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void int_io_open(int fd)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = getpid();
  iVar2 = fcntl(fd,8,(ulong)uVar1);
  if (iVar2 == -1) {
    perror("fcntl F_SETOWN error");
  }
  uVar1 = fcntl(fd,3,0);
  iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x2000));
  if (iVar2 != -1) {
    return;
  }
  perror("fcntl F_SETFL on error");
  return;
}

Assistant:

void int_io_open(int fd)
{
  DBPRINT(("int_io_open %d\n", fd));
#ifdef DOS
/* would turn on DOS kbd signal handler here */
#elif defined(O_ASYNC)
  if (fcntl(fd, F_SETOWN, getpid()) == -1) perror("fcntl F_SETOWN error");
  if (fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | O_ASYNC) == -1) perror("fcntl F_SETFL on error");
#elif defined(FASYNC) && defined(FNDELAY)
  if (fcntl(fd, F_SETOWN, getpid()) == -1) perror("fcntl F_SETOWN error");
  if (fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | FNDELAY | FASYNC) == -1) perror("fcntl F_SETFL on error");
#else
#warning "No async i/o can be enabled - investigate and remedy this"
#endif
}